

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_teleport.cpp
# Opt level: O3

bool DoGroupForOne(AActor *victim,AActor *source,AActor *dest,bool floorz,bool fog)

{
  double __x;
  double __x_00;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  bool bVar5;
  undefined7 in_register_00000009;
  double dVar6;
  double dVar7;
  DAngle local_50;
  undefined1 local_48 [16];
  double local_38;
  
  dVar6 = (victim->__Pos).X;
  dVar7 = (victim->__Pos).Y;
  dVar3 = (source->__Pos).X;
  dVar4 = (source->__Pos).Y;
  __x = FFastTrig::cos(&fasttrig,
                       ((dest->Angles).Yaw.Degrees - (source->Angles).Yaw.Degrees) *
                       11930464.711111112 + 6755399441055744.0);
  __x_00 = FFastTrig::sin(&fasttrig,__x);
  dVar1 = FFastTrig::sin(&fasttrig,__x_00);
  dVar2 = FFastTrig::cos(&fasttrig,dVar1);
  if ((int)CONCAT71(in_register_00000009,floorz) == 0) {
    local_38 = ((dest->__Pos).Z + (victim->__Pos).Z) - (source->__Pos).Z;
  }
  else {
    local_38 = -2147483648.0;
  }
  dVar6 = dVar6 - dVar3;
  dVar7 = dVar7 - dVar4;
  dVar1 = (dest->__Pos).Y + dVar6 * dVar1 + dVar2 * dVar7;
  local_48._8_4_ = SUB84(dVar1,0);
  local_48._0_8_ = (dest->__Pos).X + (__x * dVar6 - dVar7 * __x_00);
  local_48._12_4_ = (int)((ulong)dVar1 >> 0x20);
  local_50.Degrees = 0.0;
  bVar5 = P_Teleport(victim,(DVector3 *)local_48,&local_50,4 - (uint)fog);
  (victim->Angles).Yaw.Degrees =
       (double)((ulong)((((victim->Angles).Yaw.Degrees + (dest->Angles).Yaw.Degrees) -
                        (source->Angles).Yaw.Degrees) * 11930464.711111112 + 6755399441055744.0) &
               0xffffffff) * 8.381903171539307e-08;
  return bVar5;
}

Assistant:

static bool DoGroupForOne (AActor *victim, AActor *source, AActor *dest, bool floorz, bool fog)
{
	DAngle an = dest->Angles.Yaw - source->Angles.Yaw;
	DVector2 off = victim->Pos() - source->Pos();
	DAngle offAngle = victim->Angles.Yaw - source->Angles.Yaw;
	DVector2 newp = { off.X * an.Cos() - off.Y * an.Sin(), off.X * an.Sin() + off.Y * an.Cos() };
	double z = floorz ? ONFLOORZ : dest->Z() + victim->Z() - source->Z();

	bool res =
		P_Teleport (victim, DVector3(dest->Pos().XY() + newp, z),
							0., fog ? (TELF_DESTFOG | TELF_SOURCEFOG) : TELF_KEEPORIENTATION);
	// P_Teleport only changes angle if fog is true
	victim->Angles.Yaw = (dest->Angles.Yaw + victim->Angles.Yaw - source->Angles.Yaw).Normalized360();

	return res;
}